

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

void setup_one_ghash_entry(ptls_fusion_aesgcm_context_t *ctx)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  longlong in_RDX;
  longlong in_RSI;
  longlong lVar4;
  longlong lVar5;
  __m128i alVar6;
  __m128i y;
  size_t *local_78;
  long local_70;
  ptls_fusion_aesgcm_context128 *ctx128;
  ptls_fusion_aesgcm_context256 *ctx256;
  __m128i H0;
  __m128i *Hprev;
  __m128i *r;
  __m128i *H;
  ptls_fusion_aesgcm_context_t *ctx_local;
  
  if ((ctx->ecb).aesni256 == '\0') {
    r = (__m128i *)(ctx[1].ecb.keys.m256 + ctx->ghash_cnt);
    lVar3 = ctx->ghash_cnt * 0x20;
    Hprev = (__m128i *)((long)&ctx[1].ecb.keys + lVar3 + 0x10);
    if (ctx->ghash_cnt == 0) {
      local_78 = (size_t *)0x0;
    }
    else {
      lVar3 = ctx->ghash_cnt * 0x20 + -0x20;
      local_78 = &ctx->capacity + ctx->ghash_cnt * 4;
    }
    H0[1] = (longlong)local_78;
  }
  else {
    r = (__m128i *)
        ((long)&ctx[1].ecb.keys +
        (long)(int)(uint)((ctx->ghash_cnt & 1) == 0) * 0x10 + (ctx->ghash_cnt >> 1) * 0x40);
    lVar3 = (long)(int)(uint)((ctx->ghash_cnt & 1) == 0) * 0x10;
    Hprev = (__m128i *)((long)&ctx[1].ecb.keys + lVar3 + (ctx->ghash_cnt >> 1) * 0x40 + 0x20);
    if (ctx->ghash_cnt == 0) {
      local_70 = 0;
    }
    else {
      lVar3 = (long)(int)(uint)((ctx->ghash_cnt - 1 & 1) == 0) * 0x10;
      local_70 = (long)&ctx[1].ecb.keys + lVar3 + (ctx->ghash_cnt - 1 >> 1) * 0x40;
    }
    H0[1] = local_70;
  }
  if (H0[1] != 0) {
    lVar4 = *(longlong *)H0[1];
    lVar5 = *(longlong *)(H0[1] + 8);
    alVar6[1] = in_RSI;
    alVar6[0] = (longlong)ctx;
    y[1] = lVar3;
    y[0] = in_RDX;
    gfmul(alVar6,y);
    (*r)[0] = lVar4;
    (*r)[1] = lVar5;
  }
  alVar6 = (__m128i)vpshufd_avx((undefined1  [16])*r,0x4e);
  *Hprev = alVar6;
  uVar1 = (*Hprev)[1];
  uVar2 = (*r)[1];
  (*Hprev)[0] = (*Hprev)[0] ^ (*r)[0];
  (*Hprev)[1] = uVar1 ^ uVar2;
  ctx->ghash_cnt = ctx->ghash_cnt + 1;
  return;
}

Assistant:

static void setup_one_ghash_entry(ptls_fusion_aesgcm_context_t *ctx)
{
    __m128i *H, *r, *Hprev, H0;

    if (ctx->ecb.aesni256) {
        struct ptls_fusion_aesgcm_context256 *ctx256 = (void *)ctx;
#define GET_SLOT(i, mem) (&ctx256->ghash[(i) / 2].mem[(i) % 2 == 0])
        H = GET_SLOT(ctx->ghash_cnt, H);
        r = GET_SLOT(ctx->ghash_cnt, r);
        Hprev = ctx->ghash_cnt == 0 ? NULL : GET_SLOT(ctx->ghash_cnt - 1, H);
#undef GET_SLOT
        H0 = ctx256->ghash[0].H[1];
    } else {
        struct ptls_fusion_aesgcm_context128 *ctx128 = (void *)ctx;
        H = &ctx128->ghash[ctx->ghash_cnt].H;
        r = &ctx128->ghash[ctx->ghash_cnt].r;
        Hprev = ctx->ghash_cnt == 0 ? NULL : &ctx128->ghash[ctx->ghash_cnt - 1].H;
        H0 = ctx128->ghash[0].H;
    }

    if (Hprev != NULL)
        *H = gfmul(*Hprev, H0);

    *r = _mm_shuffle_epi32(*H, 78);
    *r = _mm_xor_si128(*r, *H);

    ++ctx->ghash_cnt;
}